

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ClockingSkewSyntax * __thiscall slang::parsing::Parser::parseClockingSkew(Parser *this)

{
  bool bVar1;
  TimingControlSyntax *delay;
  ClockingSkewSyntax *pCVar2;
  Token edge;
  
  edge = parseEdgeKeyword(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Hash);
  if (bVar1) {
    delay = parseTimingControl(this,false);
  }
  else {
    delay = (TimingControlSyntax *)0x0;
  }
  if (edge.info != (Info *)0x0 || delay != (TimingControlSyntax *)0x0) {
    pCVar2 = slang::syntax::SyntaxFactory::clockingSkew(&this->factory,edge,delay);
    return pCVar2;
  }
  return (ClockingSkewSyntax *)0x0;
}

Assistant:

ClockingSkewSyntax* Parser::parseClockingSkew() {
    Token edge = parseEdgeKeyword();

    TimingControlSyntax* delay = nullptr;
    if (peek(TokenKind::Hash))
        delay = parseTimingControl();

    if (!edge && !delay)
        return nullptr;

    return &factory.clockingSkew(edge, delay);
}